

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::PragmaList::~PragmaList(PragmaList *this)

{
  bool bVar1;
  reference ppPVar2;
  PragmaDefinition *pragma;
  iterator __end2;
  iterator __begin2;
  Pragmas *__range2;
  PragmaList *this_local;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__PragmaList_0020ce98;
  __end2 = std::
           vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
           ::begin(&this->pragmas);
  pragma = (PragmaDefinition *)
           std::
           vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>
           ::end(&this->pragmas);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<Lodtalk::AST::PragmaDefinition_**,_std::vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>_>
                                *)&pragma);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::PragmaDefinition_**,_std::vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>_>
              ::operator*(&__end2);
    if (*ppPVar2 != (PragmaDefinition *)0x0) {
      (*((*ppPVar2)->super_Node)._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::PragmaDefinition_**,_std::vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<Lodtalk::AST::PragmaDefinition_*,_std::allocator<Lodtalk::AST::PragmaDefinition_*>_>::
  ~vector(&this->pragmas);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

PragmaList::~PragmaList()
{
    for(auto pragma : pragmas)
        delete pragma;
}